

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

bool bloaty::DoParseOptions
               (bool skip_unknown,int *argc,char ***argv,Options *options,
               OutputOptions *output_options)

{
  byte *pbVar1;
  uint uVar2;
  char *pcVar3;
  char **ppcVar4;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  FILE *__stream;
  int iVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  bool bVar9;
  bool bVar10;
  string *psVar11;
  long lVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  _Alloc_hider value;
  Options_Demangle value_00;
  int iVar13;
  Options_SortBy value_01;
  undefined7 in_register_00000039;
  Arg *a0;
  string_view flag;
  string_view flag_00;
  string_view flag_01;
  string_view flag_02;
  string_view flag_03;
  string_view flag_04;
  string_view flag_05;
  string_view flag_06;
  string_view flag_07;
  string_view flag_08;
  string_view flag_09;
  string_view flag_10;
  string_view flag_11;
  string_view flag_12;
  string_view flag_13;
  string_view flag_14;
  string_view flag_15;
  string_view flag_16;
  string_view flag_17;
  string_view flag_18;
  string_view flag_19;
  string_view flag_20;
  string_view flag_21;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  string_view prefix;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view sVar14;
  string_view option;
  char *local_348;
  uint64_t uint64_option;
  undefined4 local_338;
  int int_option;
  IstreamInputStream stream;
  ArgParser args;
  string local_288;
  string local_258;
  ifstream input_file;
  string *psStack_230;
  
  local_338 = (undefined4)CONCAT71(in_register_00000039,skip_unknown);
  a0 = (Arg *)output_options;
  ArgParser::ArgParser(&args,argc,argv);
  option._M_len = 0;
  option._M_str = (char *)0x0;
  bVar10 = false;
  local_348 = "\'--\' option should only be specified once";
  bVar6 = false;
LAB_0017d6d7:
  do {
    while( true ) {
      bVar9 = bVar6;
      iVar5 = args.index_;
      iVar13 = args.argc_;
      if (args.index_ == args.argc_) {
        if (((options->data_source_).super_RepeatedPtrFieldBase.current_size_ == 0) &&
           (((options->_has_bits_).has_bits_[0] & 1) == 0)) {
          Options::add_data_source(options,"sections");
        }
        if (((bVar10) && (((options->_has_bits_).has_bits_[0] & 8) == 0)) &&
           (output_options->show < (kShowBoth|kShowVM))) {
          Options::_internal_set_sort_by
                    (options,Options_SortBy_SORTBY_FILESIZE - output_options->show);
        }
        goto LAB_0017dec0;
      }
      sVar14._M_str = "--";
      sVar14._M_len = 2;
      bVar6 = ArgParser::TryParseFlag(&args,sVar14);
      if (!bVar6) break;
      bVar6 = true;
      if (bVar9) {
        iVar13 = 0x850;
LAB_0017deeb:
        Throw(local_348,iVar13);
      }
    }
    flag._M_str = "--csv";
    flag._M_len = 5;
    bVar7 = ArgParser::TryParseFlag(&args,flag);
    bVar6 = bVar9;
    if (bVar7) {
      output_options->output_format = kCSV;
      goto LAB_0017d6d7;
    }
    flag_00._M_str = "--tsv";
    flag_00._M_len = 5;
    bVar7 = ArgParser::TryParseFlag(&args,flag_00);
    if (!bVar7) {
      flag_01._M_str = "--raw-map";
      flag_01._M_len = 9;
      bVar7 = ArgParser::TryParseFlag(&args,flag_01);
      if (bVar7) {
        *(byte *)(options->_has_bits_).has_bits_ = (byte)(options->_has_bits_).has_bits_[0] | 0x20;
        options->dump_raw_map_ = true;
      }
      else {
        flag_02._M_str = "-c";
        flag_02._M_len = 2;
        bVar7 = ArgParser::TryParseOption(&args,flag_02,&option);
        if (bVar7) {
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)&stream,&option,(allocator<char> *)&local_288);
          std::ifstream::ifstream(&input_file,(string *)&stream,_S_in);
          std::__cxx11::string::~string((string *)&stream);
          cVar8 = std::__basic_file<char>::is_open();
          if (cVar8 == '\0') {
            stream.copying_input_.super_CopyingInputStream._vptr_CopyingInputStream =
                 (_func_int **)option._M_str;
            stream.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream = (_func_int **)option._M_len
            ;
            format._M_str = (char *)&stream;
            format._M_len = (size_t)"couldn\'t open file $0";
            absl::Substitute_abi_cxx11_(&local_288,(absl *)0x15,format,a0);
            Throw(local_288._M_dataplus._M_p,0x85c);
          }
          google::protobuf::io::IstreamInputStream::IstreamInputStream
                    (&stream,(istream *)&input_file,-1);
          bVar9 = google::protobuf::TextFormat::Merge
                            (&stream.super_ZeroCopyInputStream,&options->super_Message);
          if (!bVar9) {
            local_288._M_dataplus._M_p = (pointer)option._M_len;
            local_288._M_string_length = (size_type)option._M_str;
            format_00._M_str = (char *)&local_288;
            format_00._M_len = (size_t)"error parsing configuration out of file $0";
            absl::Substitute_abi_cxx11_(&local_258,(absl *)0x2a,format_00,a0);
            Throw(local_258._M_dataplus._M_p,0x860);
          }
          google::protobuf::io::IstreamInputStream::~IstreamInputStream(&stream);
          std::ifstream::~ifstream(&input_file);
        }
        else {
          flag_03._M_str = "-d";
          flag_03._M_len = 2;
          bVar7 = ArgParser::TryParseOption(&args,flag_03,&option);
          if (!bVar7) {
            flag_04._M_str = "-C";
            flag_04._M_len = 2;
            bVar7 = ArgParser::TryParseOption(&args,flag_04,&option);
            if ((bVar7) ||
               (flag_05._M_str = "--demangle", flag_05._M_len = 10,
               bVar7 = ArgParser::TryParseOption(&args,flag_05,&option), bVar7)) {
              __x._M_str = option._M_str;
              __x._M_len = option._M_len;
              __y._M_str = "none";
              __y._M_len = 4;
              bVar9 = std::operator==(__x,__y);
              value_00 = Options_Demangle_DEMANGLE_NONE;
              if (!bVar9) {
                __x_00._M_str = option._M_str;
                __x_00._M_len = option._M_len;
                __y_00._M_str = "short";
                __y_00._M_len = 5;
                bVar9 = std::operator==(__x_00,__y_00);
                value_00 = Options_Demangle_DEMANGLE_SHORT;
                if (!bVar9) {
                  __x_01._M_str = option._M_str;
                  __x_01._M_len = option._M_len;
                  __y_01._M_str = "full";
                  __y_01._M_len = 4;
                  bVar9 = std::operator==(__x_01,__y_01);
                  value_00 = Options_Demangle_DEMANGLE_FULL;
                  if (!bVar9) {
                    psStack_230 = (string *)option._M_str;
                    _input_file = (pointer)option._M_len;
                    format_01._M_str = (char *)&input_file;
                    format_01._M_len = (size_t)"unknown value for --demangle: $0";
                    absl::Substitute_abi_cxx11_((string *)&stream,(absl *)0x20,format_01,a0);
                    Throw((char *)stream.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream,0x870);
                  }
                }
              }
              Options::_internal_set_demangle(options,value_00);
              goto LAB_0017d6d7;
            }
            flag_06._M_str = "--debug-file";
            flag_06._M_len = 0xc;
            bVar7 = ArgParser::TryParseOption(&args,flag_06,&option);
            if (bVar7) {
              std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                        ((string *)&input_file,&option,(allocator<char> *)&stream);
              google::protobuf::internal::RepeatedPtrFieldBase::
              Add<google::protobuf::RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::TypeHandler,_nullptr>
                        (&(options->debug_filename_).super_RepeatedPtrFieldBase,(Type *)&input_file)
              ;
            }
            else {
              flag_07._M_str = "--debug-fileoff";
              flag_07._M_len = 0xf;
              bVar7 = ArgParser::TryParseUint64Option(&args,flag_07,&uint64_option);
              if (bVar7) {
                uVar2 = (options->_has_bits_).has_bits_[0];
                if ((char)uVar2 < '\0') {
                  iVar13 = 0x876;
                  local_348 = "currently we only support a single debug fileoff";
                  goto LAB_0017deeb;
                }
                (options->_has_bits_).has_bits_[0] = uVar2 | 0x80;
                options->debug_fileoff_ = uint64_option;
                goto LAB_0017d6d7;
              }
              flag_08._M_str = "--debug-vmaddr";
              flag_08._M_len = 0xe;
              bVar7 = ArgParser::TryParseUint64Option(&args,flag_08,&uint64_option);
              if (bVar7) {
                uVar2 = (options->_has_bits_).has_bits_[0];
                if ((uVar2 & 0x40) != 0) {
                  iVar13 = 0x87b;
                  local_348 = "currently we only support a single debug vmaddr";
                  goto LAB_0017deeb;
                }
                (options->_has_bits_).has_bits_[0] = uVar2 | 0x40;
                options->debug_vmaddr_ = uint64_option;
                goto LAB_0017d6d7;
              }
              flag_09._M_str = "--disassemble";
              flag_09._M_len = 0xd;
              bVar7 = ArgParser::TryParseOption(&args,flag_09,&option);
              if (bVar7) {
                psVar11 = Options::_internal_mutable_disassemble_function_abi_cxx11_(options);
                std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          ((string *)&input_file,&option,(allocator<char> *)&stream);
                std::__cxx11::string::operator=((string *)psVar11,(string *)&input_file);
                std::__cxx11::string::~string((string *)&input_file);
                goto LAB_0017d6d7;
              }
              flag_10._M_str = "-n";
              flag_10._M_len = 2;
              bVar7 = ArgParser::TryParseIntegerOption(&args,flag_10,&int_option);
              if (bVar7) {
                if ((long)int_option == 0) {
                  pbVar1 = (byte *)((long)(options->_has_bits_).has_bits_ + 1);
                  *pbVar1 = *pbVar1 | 1;
                  options->max_rows_per_level_ = 0x7fffffffffffffff;
                }
                else {
                  pbVar1 = (byte *)((long)(options->_has_bits_).has_bits_ + 1);
                  *pbVar1 = *pbVar1 | 1;
                  options->max_rows_per_level_ = (long)int_option;
                }
                goto LAB_0017d6d7;
              }
              flag_11._M_str = "--domain";
              flag_11._M_len = 8;
              bVar7 = ArgParser::TryParseOption(&args,flag_11,&option);
              if (bVar7) {
                __x_02._M_str = option._M_str;
                __x_02._M_len = option._M_len;
                __y_02._M_str = "vm";
                __y_02._M_len = 2;
                bVar10 = std::operator==(__x_02,__y_02);
                if (bVar10) {
                  show = kShowVM;
LAB_0017dc19:
                  output_options->show = show;
                }
                else {
                  __x_06._M_str = option._M_str;
                  __x_06._M_len = option._M_len;
                  __y_06._M_str = "file";
                  __y_06._M_len = 4;
                  bVar10 = std::operator==(__x_06,__y_06);
                  if (!bVar10) {
                    __x_07._M_str = option._M_str;
                    __x_07._M_len = option._M_len;
                    __y_07._M_str = "both";
                    __y_07._M_len = 4;
                    bVar10 = std::operator==(__x_07,__y_07);
                    if (!bVar10) {
                      psStack_230 = (string *)option._M_str;
                      _input_file = (pointer)option._M_len;
                      format_04._M_str = (char *)&input_file;
                      format_04._M_len = (size_t)"unknown value for --domain: $0";
                      absl::Substitute_abi_cxx11_((string *)&stream,(absl *)0x1e,format_04,a0);
                      Throw((char *)stream.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream,0x88f
                           );
                    }
                    show = kShowBoth;
                    goto LAB_0017dc19;
                  }
                  output_options->show = kShowFile;
                  show = kShowFile;
                }
                bVar10 = true;
                goto LAB_0017d6d7;
              }
              flag_12._M_str = "-s";
              flag_12._M_len = 2;
              bVar7 = ArgParser::TryParseOption(&args,flag_12,&option);
              if (bVar7) {
                __x_03._M_str = option._M_str;
                __x_03._M_len = option._M_len;
                __y_03._M_str = "vm";
                __y_03._M_len = 2;
                bVar9 = std::operator==(__x_03,__y_03);
                value_01 = Options_SortBy_SORTBY_VMSIZE;
                if (!bVar9) {
                  __x_04._M_str = option._M_str;
                  __x_04._M_len = option._M_len;
                  __y_04._M_str = "file";
                  __y_04._M_len = 4;
                  bVar9 = std::operator==(__x_04,__y_04);
                  value_01 = Options_SortBy_SORTBY_FILESIZE;
                  if (!bVar9) {
                    __x_05._M_str = option._M_str;
                    __x_05._M_len = option._M_len;
                    __y_05._M_str = "both";
                    __y_05._M_len = 4;
                    bVar9 = std::operator==(__x_05,__y_05);
                    value_01 = Options_SortBy_SORTBY_BOTH;
                    if (!bVar9) {
                      psStack_230 = (string *)option._M_str;
                      _input_file = (pointer)option._M_len;
                      format_03._M_str = (char *)&input_file;
                      format_03._M_len = (size_t)"unknown value for -s: $0";
                      absl::Substitute_abi_cxx11_((string *)&stream,(absl *)0x18,format_03,a0);
                      Throw((char *)stream.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream,0x899
                           );
                    }
                  }
                }
                Options::_internal_set_sort_by(options,value_01);
                goto LAB_0017d6d7;
              }
              flag_13._M_str = "--source-filter";
              flag_13._M_len = 0xf;
              bVar7 = ArgParser::TryParseOption(&args,flag_13,&option);
              if (!bVar7) {
                flag_14._M_str = "--source-map";
                flag_14._M_len = 0xc;
                bVar7 = ArgParser::TryParseOption(&args,flag_14,&option);
                if (bVar7) {
                  std::__cxx11::string::
                  string<std::basic_string_view<char,std::char_traits<char>>,void>
                            ((string *)&input_file,&option,(allocator<char> *)&stream);
                  google::protobuf::internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::TypeHandler,_nullptr>
                            (&(options->source_map_).super_RepeatedPtrFieldBase,(Type *)&input_file)
                  ;
                  goto LAB_0017d97b;
                }
                flag_15._M_str = "-v";
                flag_15._M_len = 2;
                bVar7 = ArgParser::TryParseFlag(&args,flag_15);
                if (bVar7) {
                  *(byte *)(options->_has_bits_).has_bits_ =
                       (byte)(options->_has_bits_).has_bits_[0] | 0x10;
                  options->verbose_level_ = 1;
                }
                else {
                  flag_16._M_str = "-vv";
                  flag_16._M_len = 3;
                  bVar7 = ArgParser::TryParseFlag(&args,flag_16);
                  if (bVar7) {
                    *(byte *)(options->_has_bits_).has_bits_ =
                         (byte)(options->_has_bits_).has_bits_[0] | 0x10;
                    options->verbose_level_ = 2;
                  }
                  else {
                    flag_17._M_str = "-vvv";
                    flag_17._M_len = 4;
                    bVar7 = ArgParser::TryParseFlag(&args,flag_17);
                    if (bVar7) {
                      *(byte *)(options->_has_bits_).has_bits_ =
                           (byte)(options->_has_bits_).has_bits_[0] | 0x10;
                      options->verbose_level_ = 3;
                    }
                    else {
                      flag_18._M_str = "-w";
                      flag_18._M_len = 2;
                      bVar7 = ArgParser::TryParseFlag(&args,flag_18);
                      if (bVar7) {
                        output_options->max_label_len = 0xffffffffffffffff;
                      }
                      else {
                        flag_19._M_str = "--list-sources";
                        flag_19._M_len = 0xe;
                        bVar7 = ArgParser::TryParseFlag(&args,flag_19);
                        if (bVar7) {
                          for (lVar12 = 0x10; __stream = _stderr, lVar12 != 0x100;
                              lVar12 = lVar12 + 0x18) {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&stream,*(char **)(&UNK_005fd0e8 + lVar12),
                                       (allocator<char> *)&local_288);
                            anon_unknown_34::FixedWidthString
                                      ((string *)&input_file,(string *)&stream,0xf);
                            fprintf(__stream,"%s %s\n",_input_file,
                                    *(undefined8 *)((long)&data_sources + lVar12));
                            std::__cxx11::string::~string((string *)&input_file);
                            std::__cxx11::string::~string((string *)&stream);
                          }
LAB_0017dec0:
                          std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
                                    (&args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>
                                    );
                          return iVar5 == iVar13;
                        }
                        flag_20._M_str = "--help";
                        flag_20._M_len = 6;
                        bVar7 = ArgParser::TryParseFlag(&args,flag_20);
                        if (bVar7) {
                          puts(
                              "Bloaty McBloatface: a size profiler for binaries.\n\nUSAGE: bloaty [OPTION]... FILE... [-- BASE_FILE...]\n\nOptions:\n\n  --csv              Output in CSV format instead of human-readable.\n  --tsv              Output in TSV format instead of human-readable.\n  -c FILE            Load configuration from <file>.\n  -d SOURCE,SOURCE   Comma-separated list of sources to scan.\n  --debug-file=FILE  Use this file for debug symbols and/or symbol table.\n  --source-map=ID=FILE\n                     Use this source map file for the binary. The ID can be\n                     the build ID (or Wasm sourceMappingURL) or the file path\n                     as specified in the command line.\n                     Currently only supported for Wasm.\n  -C MODE            How to demangle symbols.  Possible values are:\n  --demangle=MODE      --demangle=none   no demangling, print raw symbols\n                       --demangle=short  demangle, but omit arg/return types\n                       --demangle=full   print full demangled type\n                     The default is --demangle=short.\n  --disassemble=FUNCTION\n                     Disassemble this function (EXPERIMENTAL)\n  --domain=DOMAIN    Which domains to show.  Possible values are:\n                       --domain=vm\n                       --domain=file\n                       --domain=both (the default)\n  -n NUM             How many rows to show per level before collapsing\n                     other keys into \'[Other]\'.  Set to \'0\' for unlimited.\n                     Defaults to 20.\n  -s SORTBY          Whether to sort by VM or File size.  Possible values\n                     are:\n                       -s vm\n                       -s file\n                       -s both (the default: sorts by max(vm, file)).\n  -w                 Wide output; don\'t truncate long labels.\n  --help             Display this message and exit.\n  --list-sources     Show a list of available sources and exit.\n  --source-filter=PATTERN\n                     Only show keys with names matching this pattern.\n\nOptions for deb..." /* TRUNCATED STRING LITERAL */
                              );
                          goto LAB_0017dec0;
                        }
                        flag_21._M_str = "--version";
                        flag_21._M_len = 9;
                        bVar7 = ArgParser::TryParseFlag(&args,flag_21);
                        if (bVar7) {
                          puts("Bloaty McBloatface 1.1");
                          exit(0);
                        }
                        sVar14 = ArgParser::Arg(&args);
                        prefix._M_str = "-";
                        prefix._M_len = 1;
                        bVar7 = absl::StartsWith(sVar14,prefix);
                        if (bVar7) {
                          if ((char)local_338 == '\0') {
                            _input_file = ArgParser::Arg(&args);
                            format_02._M_str = (char *)&input_file;
                            format_02._M_len = (size_t)"Unknown option: $0";
                            absl::Substitute_abi_cxx11_((string *)&stream,(absl *)0x12,format_02,a0)
                            ;
                            Throw((char *)stream.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream
                                  ,0x8b7);
                          }
                          lVar12 = (long)args.index_;
                          args.index_ = args.index_ + 1;
                          pcVar3 = args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar12];
                          ppcVar4 = *args.out_argv_;
                          iVar13 = *args.out_argc_;
                          *args.out_argc_ = iVar13 + 1;
                          ppcVar4[iVar13] = pcVar3;
                        }
                        else {
                          if (bVar9) {
                            output_options->showAllSizesCSV = true;
                            stream._0_16_ = ArgParser::ConsumeArg(&args);
                            std::__cxx11::string::
                            string<std::basic_string_view<char,std::char_traits<char>>,void>
                                      ((string *)&input_file,
                                       (basic_string_view<char,_std::char_traits<char>_> *)&stream,
                                       (allocator<char> *)&local_288);
                            google::protobuf::internal::RepeatedPtrFieldBase::
                            Add<google::protobuf::RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::TypeHandler,_nullptr>
                                      (&(options->base_filename_).super_RepeatedPtrFieldBase,
                                       (Type *)&input_file);
                          }
                          else {
                            stream._0_16_ = ArgParser::ConsumeArg(&args);
                            std::__cxx11::string::
                            string<std::basic_string_view<char,std::char_traits<char>>,void>
                                      ((string *)&input_file,
                                       (basic_string_view<char,_std::char_traits<char>_> *)&stream,
                                       (allocator<char> *)&local_288);
                            google::protobuf::internal::RepeatedPtrFieldBase::
                            Add<google::protobuf::RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::TypeHandler,_nullptr>
                                      (&(options->filename_).super_RepeatedPtrFieldBase,
                                       (Type *)&input_file);
                          }
                          std::__cxx11::string::~string((string *)&input_file);
                        }
                      }
                    }
                  }
                }
                goto LAB_0017d6d7;
              }
              std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                        ((string *)&input_file,&option,(allocator<char> *)&stream);
              Options::set_source_filter(options,(string *)&input_file);
            }
LAB_0017d97b:
            std::__cxx11::string::~string((string *)&input_file);
            goto LAB_0017d6d7;
          }
          stream.copying_input_.super_CopyingInputStream._vptr_CopyingInputStream =
               (_func_int **)option._M_str;
          stream.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream = (_func_int **)option._M_len;
          stream.copying_input_.input_._0_1_ = 0x2c;
          absl::strings_internal::
          Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
          ::
          operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&input_file,
                     (Splitter<absl::ByChar,_absl::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                      *)&stream);
          psVar11 = psStack_230;
          for (value._M_p = _input_file; (string *)value._M_p != psVar11;
              value._M_p = value._M_p + 0x20) {
            Options::add_data_source(options,(string *)value._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&input_file);
        }
      }
      goto LAB_0017d6d7;
    }
    output_options->output_format = kTSV;
  } while( true );
}

Assistant:

bool DoParseOptions(bool skip_unknown, int* argc, char** argv[],
                    Options* options, OutputOptions* output_options) {
  bool saw_separator = false;
  ArgParser args(argc, argv);
  string_view option;
  int int_option;
  uint64_t uint64_option;
  bool has_domain = false;

  while (!args.IsDone()) {
    if (args.TryParseFlag("--")) {
      if (saw_separator) {
        THROW("'--' option should only be specified once");
      }
      saw_separator = true;
    } else if (args.TryParseFlag("--csv")) {
      output_options->output_format = OutputFormat::kCSV;
    } else if (args.TryParseFlag("--tsv")) {
      output_options->output_format = OutputFormat::kTSV;
    } else if (args.TryParseFlag("--raw-map")) {
      options->set_dump_raw_map(true);
    } else if (args.TryParseOption("-c", &option)) {
      std::ifstream input_file(std::string(option), std::ios::in);
      if (!input_file.is_open()) {
        THROWF("couldn't open file $0", option);
      }
      google::protobuf::io::IstreamInputStream stream(&input_file);
      if (!google::protobuf::TextFormat::Merge(&stream, options)) {
        THROWF("error parsing configuration out of file $0", option);
      }
    } else if (args.TryParseOption("-d", &option)) {
      std::vector<std::string> names = absl::StrSplit(option, ',');
      for (const auto& name : names) {
        options->add_data_source(name);
      }
    } else if (args.TryParseOption("-C", &option) ||
               args.TryParseOption("--demangle", &option)) {
      if (option == "none") {
        options->set_demangle(Options::DEMANGLE_NONE);
      } else if (option == "short") {
        options->set_demangle(Options::DEMANGLE_SHORT);
      } else if (option == "full") {
        options->set_demangle(Options::DEMANGLE_FULL);
      } else {
        THROWF("unknown value for --demangle: $0", option);
      }
    } else if (args.TryParseOption("--debug-file", &option)) {
      options->add_debug_filename(std::string(option));
    } else if (args.TryParseUint64Option("--debug-fileoff", &uint64_option)) {
      if (options->has_debug_fileoff()) {
        THROW("currently we only support a single debug fileoff");
      }
      options->set_debug_fileoff(uint64_option);
    } else if (args.TryParseUint64Option("--debug-vmaddr", &uint64_option)) {
      if (options->has_debug_vmaddr()) {
        THROW("currently we only support a single debug vmaddr");
      }
      options->set_debug_vmaddr(uint64_option);
    } else if (args.TryParseOption("--disassemble", &option)) {
      options->mutable_disassemble_function()->assign(std::string(option));
    } else if (args.TryParseIntegerOption("-n", &int_option)) {
      if (int_option == 0) {
        options->set_max_rows_per_level(INT64_MAX);
      } else {
        options->set_max_rows_per_level(int_option);
      }
    } else if (args.TryParseOption("--domain", &option)) {
      has_domain = true;
      if (option == "vm") {
        show = output_options->show = ShowDomain::kShowVM;
      } else if (option == "file") {
        show = output_options->show = ShowDomain::kShowFile;
      } else if (option == "both") {
        show = output_options->show = ShowDomain::kShowBoth;
      } else {
        THROWF("unknown value for --domain: $0", option);
      }
    } else if (args.TryParseOption("-s", &option)) {
      if (option == "vm") {
        options->set_sort_by(Options::SORTBY_VMSIZE);
      } else if (option == "file") {
        options->set_sort_by(Options::SORTBY_FILESIZE);
      } else if (option == "both") {
        options->set_sort_by(Options::SORTBY_BOTH);
      } else {
        THROWF("unknown value for -s: $0", option);
      }
    } else if (args.TryParseOption("--source-filter", &option)) {
      options->set_source_filter(std::string(option));
    } else if (args.TryParseOption("--source-map", &option)) {
      options->add_source_map(std::string(option));
    } else if (args.TryParseFlag("-v")) {
      options->set_verbose_level(1);
    } else if (args.TryParseFlag("-vv")) {
      options->set_verbose_level(2);
    } else if (args.TryParseFlag("-vvv")) {
      options->set_verbose_level(3);
    } else if (args.TryParseFlag("-w")) {
      output_options->max_label_len = SIZE_MAX;
    } else if (args.TryParseFlag("--list-sources")) {
      for (const auto& source : data_sources) {
        fprintf(stderr, "%s %s\n", FixedWidthString(source.name, 15).c_str(),
                source.description);
      }
      return false;
    } else if (args.TryParseFlag("--help")) {
      puts(usage);
      return false;
    } else if (args.TryParseFlag("--version")) {
      printf("Bloaty McBloatface 1.1\n");
      exit(0);
    } else if (absl::StartsWith(args.Arg(), "-")) {
      if (skip_unknown) {
        args.ConsumeAndSaveArg();
      } else {
        THROWF("Unknown option: $0", args.Arg());
      }
    } else {
      if (saw_separator) {
        output_options->showAllSizesCSV = true;
        options->add_base_filename(std::string(args.ConsumeArg()));
      } else {
        options->add_filename(std::string(args.ConsumeArg()));
      }
    }
  }

  if (options->data_source_size() == 0 &&
      !options->has_disassemble_function()) {
    // Default when no sources are specified.
    options->add_data_source("sections");
  }

  if (has_domain && !options->has_sort_by()) {
    // Default to sorting by what we are showing.
    switch (output_options->show) {
      case ShowDomain::kShowFile:
        options->set_sort_by(Options::SORTBY_FILESIZE);
        break;
      case ShowDomain::kShowVM:
        options->set_sort_by(Options::SORTBY_VMSIZE);
        break;
      case ShowDomain::kShowBoth:
        options->set_sort_by(Options::SORTBY_BOTH);
        break;
    }
  }

  return true;
}